

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::detail::fixed_dynamic_array<char,_8200U,_std::allocator<unsigned_int>_>::
fixed_dynamic_array(fixed_dynamic_array<char,_8200U,_std::allocator<unsigned_int>_> *this,
                   size_type size_in,value_type *value_in,allocator_type *alloc_in)

{
  value_type vVar1;
  long lVar2;
  ulong in_RAX;
  ulong uVar3;
  ulong uVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this,0x2008,
             (const_reference)((long)&uStack_28 + 7),alloc_in);
  *(undefined ***)this = &PTR__dynamic_array_00216e20;
  lVar2 = *(long *)(this + 0x10);
  uVar4 = 0x2008;
  if (size_in < 0x2008) {
    uVar4 = (ulong)size_in;
  }
  vVar1 = *value_in;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(value_type *)(lVar2 + uVar3) = vVar1;
  }
  return;
}

Assistant:

explicit constexpr fixed_dynamic_array(const typename base_class_type::size_type       size_in  = MySize,
                                           const typename base_class_type::value_type&     value_in = typename base_class_type::value_type(),
                                           const typename base_class_type::allocator_type& alloc_in = typename base_class_type::allocator_type())
      : base_class_type(MySize, typename base_class_type::value_type(), alloc_in)
    {
      detail::fill_unsafe(base_class_type::begin(),
                          base_class_type::begin() + (detail::min_unsafe)(MySize, static_cast<typename base_class_type::size_type>(size_in)),
                          value_in);
    }